

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Vec_Int_t * Wlc_NtkCollectMemory(Wlc_Ntk_t *p,int fClean)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  int iVar5;
  Vec_Int_t *vTemp;
  long lVar6;
  long lVar7;
  
  pVVar3 = Wlc_NtkCollectMemSizes(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  p_00->pArray = piVar4;
  if (1 < p->iObj) {
    lVar7 = 1;
    do {
      if (p->nObjsAlloc <= lVar7) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = p->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar1[lVar7] & (undefined1  [24])0x3e) ==
          (undefined1  [24])0x36) {
LAB_0035b17d:
        Vec_IntPush(p_00,(int)lVar7);
      }
      else {
        iVar5 = pWVar1[lVar7].End - pWVar1[lVar7].Beg;
        iVar2 = -iVar5;
        if (0 < iVar5) {
          iVar2 = iVar5;
        }
        if (0 < (long)pVVar3->nSize) {
          lVar6 = 0;
          do {
            if (pVVar3->pArray[lVar6] == iVar2 + 1) goto LAB_0035b17d;
            lVar6 = lVar6 + 1;
          } while (pVVar3->nSize != lVar6);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->iObj);
  }
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  piVar4 = p_00->pArray;
  qsort(piVar4,(long)p_00->nSize,4,Vec_IntSortCompare1);
  pVVar3 = p_00;
  if (fClean != 0) {
    pVVar3 = Wlc_NtkCleanObjects(p,p_00);
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMemory( Wlc_Ntk_t * p, int fClean )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vMemSizes = Wlc_NtkCollectMemSizes( p );
    Vec_Int_t * vMemObjs = Vec_IntAlloc( 10 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE || Wlc_ObjType(pObj) == WLC_OBJ_READ )
            Vec_IntPush( vMemObjs, i );
        else if ( Vec_IntFind(vMemSizes, Wlc_ObjRange(pObj)) >= 0 )
            Vec_IntPush( vMemObjs, i );
    }
    Vec_IntFree( vMemSizes );
    Vec_IntSort( vMemObjs, 0 );
    //Wlc_NtkPrintNodeArray( p, vMemObjs ); 
    if ( fClean )
    {
        Vec_Int_t * vTemp;
        vMemObjs = Wlc_NtkCleanObjects( p, vTemp = vMemObjs );
        Vec_IntFree( vTemp );
    }
    return vMemObjs;
}